

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,Field *a,Field *b)

{
  bool bVar1;
  bool bVar2;
  Type b_00;
  
  bVar1 = Field::operator==((Field *)this,a);
  bVar2 = true;
  if (!bVar1) {
    if ((a->mutable_ == Immutable && *(int *)(this + 0xc) == 0) &&
       (*(PackedType *)(this + 8) == a->packedType)) {
      bVar1 = isSubType(*(SubTyper **)this,(Type)(a->type).id,b_00);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SubTyper::isSubType(const Field& a, const Field& b) {
  if (a == b) {
    return true;
  }
  // Immutable fields can be subtypes.
  return a.mutable_ == Immutable && b.mutable_ == Immutable &&
         a.packedType == b.packedType && isSubType(a.type, b.type);
}